

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

sample * __thiscall
Catch::Benchmark::Detail::
resample<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)>
          (sample *__return_storage_ptr__,Detail *this,
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *rng,int resamples,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last,
          _func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
          **estimator)

{
  anon_class_40_5_f2dc1741 __gen;
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> __first;
  iterator __first_00;
  iterator __last;
  undefined4 in_register_0000000c;
  undefined1 local_50 [8];
  uniform_int_distribution<long> dist;
  difference_type n;
  _func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
  **estimator_local;
  int resamples_local;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *rng_local;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_local;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first_local;
  sample *out;
  
  last_local._M_current = (double *)CONCAT44(in_register_0000000c,resamples);
  rng_local = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *)first._M_current;
  dist._M_param._M_b =
       __gnu_cxx::operator-
                 ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                  &rng_local,&last_local);
  clara::std::uniform_int_distribution<long>::uniform_int_distribution
            ((uniform_int_distribution<long> *)local_50,0,dist._M_param._M_b + -1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__);
  clara::std::vector<double,_std::allocator<double>_>::reserve
            (__return_storage_ptr__,(long)(int)rng);
  __first = std::back_inserter<std::vector<double,std::allocator<double>>>(__return_storage_ptr__);
  __gen.first._M_current = last_local._M_current;
  __gen.n = dist._M_param._M_b;
  __gen.estimator =
       (_func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
        **)last._M_current;
  __gen.dist = (uniform_int_distribution<long> *)local_50;
  __gen.rng = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *)this;
  std::
  generate_n<std::back_insert_iterator<std::vector<double,std::allocator<double>>>,int,Catch::Benchmark::Detail::resample<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)>(std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&,int,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>))::_lambda()_1_>
            (__first,(int)rng,__gen);
  __first_00 = clara::std::vector<double,_std::allocator<double>_>::begin(__return_storage_ptr__);
  __last = clara::std::vector<double,_std::allocator<double>_>::end(__return_storage_ptr__);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first_00._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current);
  return __return_storage_ptr__;
}

Assistant:

sample resample(URng& rng, int resamples, Iterator first, Iterator last, Estimator& estimator) {
                auto n = last - first;
                std::uniform_int_distribution<decltype(n)> dist(0, n - 1);

                sample out;
                out.reserve(resamples);
                std::generate_n(std::back_inserter(out), resamples, [n, first, &estimator, &dist, &rng] {
                    std::vector<double> resampled;
                    resampled.reserve(n);
                    std::generate_n(std::back_inserter(resampled), n, [first, &dist, &rng] { return first[dist(rng)]; });
                    return estimator(resampled.begin(), resampled.end());
                });
                std::sort(out.begin(), out.end());
                return out;
            }